

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

size_t ggml_hash_size(size_t min_sz)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = 0x20;
  while (uVar1 = uVar2, uVar3 < uVar1) {
    uVar2 = uVar3 + uVar1 >> 1;
    if (ggml_hash_size::primes[uVar2] < min_sz) {
      uVar3 = uVar2 + 1;
      uVar2 = uVar1;
    }
  }
  if (0x1f < uVar3) {
    return min_sz | 1;
  }
  return ggml_hash_size::primes[uVar3];
}

Assistant:

size_t ggml_hash_size(size_t min_sz) {
    // next primes after powers of two
    static const size_t primes[] = {
        2, 3, 5, 11, 17, 37, 67, 131, 257, 521, 1031,
        2053, 4099, 8209, 16411, 32771, 65537, 131101,
        262147, 524309, 1048583, 2097169, 4194319, 8388617,
        16777259, 33554467, 67108879, 134217757, 268435459,
        536870923, 1073741827, 2147483659
    };
    static const size_t n_primes = sizeof(primes)/sizeof(primes[0]);

    // find the smallest prime that is larger or equal than min_sz
    size_t l = 0;
    size_t r = n_primes;
    while (l < r) {
        size_t m = (l + r)/2;
        if (primes[m] < min_sz) {
            l = m + 1;
        } else {
            r = m;
        }
    }
    size_t sz = l < n_primes ? primes[l] : min_sz | 1;
    return sz;
}